

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O2

void rt_revsubclamp4cols(int sx,int yl,int yh)

{
  lighttable_t *plVar1;
  DWORD *pDVar2;
  DWORD *pDVar3;
  BYTE *pBVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  uint uVar10;
  
  pBVar4 = dc_temp;
  pDVar3 = dc_destblend;
  pDVar2 = dc_srcblend;
  plVar1 = dc_colormap;
  if (-1 < yh - yl) {
    iVar6 = yl << 2;
    lVar7 = (long)dc_pitch;
    pbVar8 = dc_destorg + (long)(sx + ylookup[yl]) + 3;
    lVar9 = 0;
    do {
      uVar5 = (pDVar3[pbVar8[-3]] | 0x40100400) - pDVar2[plVar1[pBVar4[lVar9 * 4 + (long)iVar6]]];
      uVar10 = uVar5 & 0x40100400;
      uVar5 = uVar10 - (uVar10 >> 5) & uVar5 | 0x1f07c1f;
      pbVar8[-3] = RGB32k.All[uVar5 >> 0xf & uVar5];
      uVar5 = (pDVar3[pbVar8[-2]] | 0x40100400) -
              pDVar2[plVar1[pBVar4[lVar9 * 4 + (long)iVar6 + 1]]];
      uVar10 = uVar5 & 0x40100400;
      uVar5 = uVar10 - (uVar10 >> 5) & uVar5 | 0x1f07c1f;
      pbVar8[-2] = RGB32k.All[uVar5 >> 0xf & uVar5];
      uVar5 = (pDVar3[pbVar8[-1]] | 0x40100400) -
              pDVar2[plVar1[pBVar4[lVar9 * 4 + (long)iVar6 + 2]]];
      uVar10 = uVar5 & 0x40100400;
      uVar5 = uVar10 - (uVar10 >> 5) & uVar5 | 0x1f07c1f;
      pbVar8[-1] = RGB32k.All[uVar5 >> 0xf & uVar5];
      uVar5 = (pDVar3[*pbVar8] | 0x40100400) - pDVar2[plVar1[pBVar4[lVar9 * 4 + (long)iVar6 + 3]]];
      uVar10 = uVar5 & 0x40100400;
      uVar5 = uVar10 - (uVar10 >> 5) & uVar5 | 0x1f07c1f;
      *pbVar8 = RGB32k.All[uVar5 >> 0xf & uVar5];
      lVar9 = lVar9 + 1;
      pbVar8 = pbVar8 + lVar7;
    } while ((yh - yl) + 1 != (int)lVar9);
  }
  return;
}

Assistant:

void rt_revsubclamp4cols (int sx, int yl, int yh)
{
	BYTE *colormap;
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;
	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4];
	pitch = dc_pitch;
	colormap = dc_colormap;

	do {
		DWORD a = (bg2rgb[dest[0]] | 0x40100400) - fg2rgb[colormap[source[0]]];
		DWORD b = a;

		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		dest[0] = RGB32k.All[(a>>15) & a];

		a = (bg2rgb[dest[1]] | 0x40100400) - fg2rgb[colormap[source[1]]];
		b = a;
		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		dest[1] = RGB32k.All[(a>>15) & a];

		a = (bg2rgb[dest[2]] | 0x40100400) - fg2rgb[colormap[source[2]]];
		b = a;
		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		dest[2] = RGB32k.All[(a>>15) & a];

		a = (bg2rgb[dest[3]] | 0x40100400) - fg2rgb[colormap[source[3]]];
		b = a;
		b &= 0x40100400;
		b = b - (b >> 5);
		a &= b;
		a |= 0x01f07c1f;
		dest[3] = RGB32k.All[(a>>15) & a];

		source += 4;
		dest += pitch;
	} while (--count);
}